

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_31::WebSocketImpl::sendImpl
          (WebSocketImpl *this,byte opcode,ArrayPtr<const_unsigned_char> message)

{
  ArrayPtr<unsigned_char> bytes;
  TransformPromiseNodeBase *pTVar1;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar2;
  bool fin;
  undefined7 in_register_00000031;
  _func_int **pp_Var3;
  Mask mask_00;
  _func_int *in_R8;
  ArrayPtr<const_unsigned_char> AVar5;
  Promise<void> PVar6;
  Mask mask;
  Array<unsigned_char> ownMessage;
  Array<unsigned_char> local_70;
  Promise<void> promise;
  Own<kj::_::PromiseNode> local_40;
  _func_int *p_Var4;
  
  pp_Var3 = (_func_int **)CONCAT71(in_register_00000031,opcode);
  if (*(char *)((long)pp_Var3 + 0x21) == '\x01') {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[40]>
              ((Fault *)&ownMessage,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x968,FAILED,"!disconnected","\"WebSocket can\'t send after disconnect()\"",
               (char (*) [40])"WebSocket can\'t send after disconnect()");
    _::Debug::Fault::fatal((Fault *)&ownMessage);
  }
  if (*(char *)((long)pp_Var3 + 0x22) != '\x01') {
    *(undefined1 *)((long)pp_Var3 + 0x22) = 1;
    fin = message.ptr._0_1_;
    if (*(char *)(pp_Var3 + 0xf) == '\x01') {
      pTVar1 = (TransformPromiseNodeBase *)operator_new(0x48);
      _::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar1,(Own<kj::_::PromiseNode> *)(pp_Var3 + 0x10),
                 _::
                 TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2415:30),_kj::_::PropagateException>
                 ::anon_class_32_3_f7a759be_for_func::operator());
      (pTVar1->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00428838;
      pTVar1[1].super_PromiseNode._vptr_PromiseNode = pp_Var3;
      *(bool *)&pTVar1[1].dependency.disposer = fin;
      pTVar1[1].dependency.ptr = (PromiseNode *)message.size_;
      pTVar1[1].continuationTracePtr = in_R8;
      ownMessage.ptr =
           (uchar *)&_::
                     HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::(anonymous_namespace)::WebSocketImpl::sendImpl(unsigned_char,kj::ArrayPtr<unsigned_char_const>)::{lambda()#1},kj::_::PropagateException>>
                     ::instance;
      ownMessage.size_ = (size_t)pTVar1;
      _::maybeChain<void>(&local_40,(Promise<void> *)&ownMessage);
      pPVar2 = local_40.ptr;
      local_70.ptr = (uchar *)local_40.disposer;
      local_40.ptr = (PromiseNode *)0x0;
      Own<kj::_::PromiseNode>::dispose(&local_40);
      (this->super_WebSocket)._vptr_WebSocket = (_func_int **)local_40.disposer;
      (this->stream).disposer = (Disposer *)pPVar2;
      local_70.size_ = 0;
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_70);
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&ownMessage);
      _::NullableValue<kj::Promise<void>_>::operator=
                ((NullableValue<kj::Promise<void>_> *)(pp_Var3 + 0xf),(void *)0x0);
      pPVar2 = extraout_RDX;
    }
    else {
      *(byte *)(pp_Var3 + 4) = *(byte *)(pp_Var3 + 4) | fin == true;
      p_Var4 = in_R8;
      Mask::Mask(&mask,(EntropySource *)pp_Var3[3]);
      mask_00.maskBytes = SUB84(p_Var4,0);
      ownMessage.disposer = (ArrayDisposer *)0x0;
      ownMessage.ptr = (uchar *)0x0;
      ownMessage.size_ = 0;
      pPVar2 = (PromiseNode *)message.size_;
      if (mask.maskBytes != (byte  [4])0x0) {
        heapArray<unsigned_char>((ArrayPtr<const_unsigned_char>)ZEXT816(0));
        Array<unsigned_char>::operator=(&ownMessage,&local_70);
        Array<unsigned_char>::~Array(&local_70);
        bytes.size_ = ownMessage.size_;
        bytes.ptr = ownMessage.ptr;
        Mask::apply(&mask,bytes);
        pPVar2 = (PromiseNode *)ownMessage.ptr;
        in_R8 = (_func_int *)ownMessage.size_;
      }
      AVar5 = Header::compose((Header *)((long)pp_Var3 + 0x23),fin,(byte)in_R8,
                              (ulong)(uint)mask.maskBytes,mask_00);
      *(ArrayPtr<const_unsigned_char> *)(pp_Var3 + 7) = AVar5;
      pp_Var3[9] = (_func_int *)pPVar2;
      pp_Var3[10] = in_R8;
      (**(code **)(*(long *)(pp_Var3[2] + 8) + 8))(&promise,pp_Var3[2] + 8,pp_Var3 + 7,2);
      if (mask.maskBytes != (byte  [4])0x0) {
        Promise<void>::attach<kj::Array<unsigned_char>>
                  ((Promise<void> *)&local_70,(Array<unsigned_char> *)&promise);
        Own<kj::_::PromiseNode>::operator=
                  ((Own<kj::_::PromiseNode> *)&promise,(Own<kj::_::PromiseNode> *)&local_70);
        Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_70);
      }
      pTVar1 = (TransformPromiseNodeBase *)operator_new(0x30);
      _::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar1,(Own<kj::_::PromiseNode> *)&promise,
                 _::
                 TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:2445:25),_kj::_::PropagateException>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      (pTVar1->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_004288c0;
      pTVar1[1].super_PromiseNode._vptr_PromiseNode = pp_Var3;
      local_70.ptr = (uchar *)&_::
                               HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::WebSocketImpl::sendImpl(unsigned_char,kj::ArrayPtr<unsigned_char_const>)::{lambda()#2},kj::_::PropagateException>>
                               ::instance;
      local_40.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::WebSocketImpl::sendImpl(unsigned_char,kj::ArrayPtr<unsigned_char_const>)::{lambda()#2},kj::_::PropagateException>>
            ::instance;
      local_70.size_ = 0;
      (this->super_WebSocket)._vptr_WebSocket =
           (_func_int **)
           &_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::WebSocketImpl::sendImpl(unsigned_char,kj::ArrayPtr<unsigned_char_const>)::{lambda()#2},kj::_::PropagateException>>
            ::instance;
      (this->stream).disposer = (Disposer *)pTVar1;
      local_40.ptr = (PromiseNode *)0x0;
      Own<kj::_::PromiseNode>::dispose(&local_40);
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_70);
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
      Array<unsigned_char>::~Array(&ownMessage);
      pPVar2 = extraout_RDX_00;
    }
    PVar6.super_PromiseBase.node.ptr = pPVar2;
    PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
    return (Promise<void>)PVar6.super_PromiseBase.node;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
            ((Fault *)&ownMessage,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x969,FAILED,"!currentlySending","\"another message send is already in progress\"",
             (char (*) [44])"another message send is already in progress");
  _::Debug::Fault::fatal((Fault *)&ownMessage);
}

Assistant:

kj::Promise<void> sendImpl(byte opcode, kj::ArrayPtr<const byte> message) {
    KJ_REQUIRE(!disconnected, "WebSocket can't send after disconnect()");
    KJ_REQUIRE(!currentlySending, "another message send is already in progress");

    currentlySending = true;

    KJ_IF_MAYBE(p, sendingPong) {
      // We recently sent a pong, make sure it's finished before proceeding.
      auto promise = p->then([this, opcode, message]() {
        currentlySending = false;
        return sendImpl(opcode, message);
      });
      sendingPong = nullptr;
      return promise;
    }

    // We don't stop the application from sending further messages after close() -- this is the
    // application's error to make. But, we do want to make sure we don't send any PONGs after a
    // close, since that would be our error. So we stack whether we closed for that reason.
    hasSentClose = hasSentClose || opcode == OPCODE_CLOSE;

    Mask mask(maskKeyGenerator);

    kj::Array<byte> ownMessage;
    if (!mask.isZero()) {
      // Sadness, we have to make a copy to apply the mask.
      ownMessage = kj::heapArray(message);
      mask.apply(ownMessage);
      message = ownMessage;
    }

    sendParts[0] = sendHeader.compose(true, opcode, message.size(), mask);
    sendParts[1] = message;

    auto promise = stream->write(sendParts);
    if (!mask.isZero()) {
      promise = promise.attach(kj::mv(ownMessage));
    }
    return promise.then([this]() {
      currentlySending = false;

      // Send queued pong if needed.
      KJ_IF_MAYBE(q, queuedPong) {
        kj::Array<byte> payload = kj::mv(*q);
        queuedPong = nullptr;
        queuePong(kj::mv(payload));
      }
    });
  }